

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_marker.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  GLFWwindow *handle;
  int height;
  int width;
  GLsizei local_30;
  GLsizei local_2c;
  
  glfwInit();
  glfwWindowHint(0x20004,0);
  glfwWindowHint(0x2200b,0x36002);
  glfwWindowHint(0x22001,0x30002);
  glfwWindowHint(0x22002,2);
  glfwWindowHint(0x22003,0);
  handle = glfwCreateWindow(300,300,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    iVar2 = 0x7d;
  }
  else {
    glfwMakeContextCurrent(handle);
    iVar1 = gladLoadGLES2Loader(glfwGetProcAddress);
    iVar2 = GLAD_GL_EXT_debug_marker;
    if (iVar1 == 0) {
      iVar2 = 1;
    }
    else {
      if (GLAD_GL_ES_VERSION_2_0 == 0) {
        __assert_fail("GLAD_GL_ES_VERSION_2_0",
                      "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/apps/egl/gles2/debug_marker.cpp"
                      ,0x62,"int main(int, char **)");
      }
      iVar1 = glfwExtensionSupported("GL_EXT_debug_marker");
      if (iVar2 != iVar1) {
        __assert_fail("GLAD_GL_EXT_debug_marker == glfwExtensionSupported(\"GL_EXT_debug_marker\")",
                      "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/apps/egl/gles2/debug_marker.cpp"
                      ,99,"int main(int, char **)");
      }
      if (GLAD_GL_EXT_debug_marker != 0) {
        if (glad_glInsertEventMarkerEXT == (PFNGLINSERTEVENTMARKEREXTPROC)0x0) {
          __assert_fail("glInsertEventMarkerEXT",
                        "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/apps/egl/gles2/debug_marker.cpp"
                        ,0x44,"void init()");
        }
        (*glad_glInsertEventMarkerEXT)(4,"Init - this should not be included");
      }
      (*glad_glClearColor)(0.4,0.4,0.4,0.0);
      glfwGetFramebufferSize(handle,&local_2c,&local_30);
      (*glad_glViewport)(0,0,local_2c,local_30);
      if (GLAD_GL_EXT_debug_marker != 0) {
        (*glad_glPushGroupMarkerEXT)(0,"draw");
      }
      (*glad_glClear)(0x4100);
      if (GLAD_GL_EXT_debug_marker != 0) {
        (*glad_glPopGroupMarkerEXT)();
      }
      glfwSwapBuffers(handle);
      glfwDestroyWindow(handle);
      glfwTerminate();
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
main(int argc, char *argv[])
{
   glfwInit();

   glfwWindowHint(GLFW_VISIBLE, GL_FALSE);
   glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_EGL_CONTEXT_API);
   glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_ES_API);
   glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
   glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

   window = glfwCreateWindow(300, 300, argv[0], NULL, NULL);
   if (!window) {
       return EXIT_SKIP;
   }

   glfwMakeContextCurrent(window);

   if (!gladLoadGLES2Loader((GLADloadproc) glfwGetProcAddress)) {
       return EXIT_FAILURE;
   }

   assert(GLAD_GL_ES_VERSION_2_0);
   assert(GLAD_GL_EXT_debug_marker == glfwExtensionSupported("GL_EXT_debug_marker"));

   init();
   reshape();
   draw();

   glfwDestroyWindow(window);
   glfwTerminate();

   return 0;
}